

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locavailable.cpp
# Opt level: O0

UBool locale_available_cleanup(void)

{
  Locale *pLVar1;
  Locale *pLVar2;
  Locale *this;
  void *in_RSI;
  
  pLVar2 = icu_63::availableLocaleList;
  if (icu_63::availableLocaleList != (Locale *)0x0) {
    if (icu_63::availableLocaleList != (Locale *)0x0) {
      pLVar1 = icu_63::availableLocaleList + -1;
      this = icu_63::availableLocaleList + *(long *)&icu_63::availableLocaleList[-1].fIsBogus;
      while (pLVar2 != this) {
        this = this + -1;
        icu_63::Locale::~Locale(this);
      }
      icu_63::UMemory::operator_delete__((UMemory *)&pLVar1->fIsBogus,in_RSI);
    }
    icu_63::availableLocaleList = (Locale *)0x0;
  }
  icu_63::availableLocaleListCount = 0;
  icu_63::UInitOnce::reset((UInitOnce *)&icu_63::gInitOnceLocale);
  return '\x01';
}

Assistant:

U_NAMESPACE_USE

    if (availableLocaleList) {
        delete []availableLocaleList;
        availableLocaleList = NULL;
    }